

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqpvalue.c
# Opt level: O3

AMQP_VALUE amqpvalue_create_uuid(uchar *value)

{
  undefined8 uVar1;
  undefined4 *puVar2;
  LOGGER_LOG p_Var3;
  AMQP_VALUE pAVar4;
  
  puVar2 = (undefined4 *)malloc(0x20);
  if (puVar2 == (undefined4 *)0x0) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 == (LOGGER_LOG)0x0) {
      pAVar4 = (AMQP_VALUE)0x0;
    }
    else {
      pAVar4 = (AMQP_VALUE)0x0;
      (*p_Var3)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
                ,"amqpvalue_create_uuid",0x39e,1,"Could not allocate memory for AMQP value");
    }
  }
  else {
    pAVar4 = (AMQP_VALUE)(puVar2 + 2);
    *puVar2 = 1;
    puVar2[2] = 0xf;
    uVar1 = *(undefined8 *)(value + 8);
    *(undefined8 *)(puVar2 + 4) = *(undefined8 *)value;
    *(undefined8 *)(puVar2 + 6) = uVar1;
  }
  return pAVar4;
}

Assistant:

AMQP_VALUE amqpvalue_create_uuid(uuid value)
{
    AMQP_VALUE result = REFCOUNT_TYPE_CREATE(AMQP_VALUE_DATA);
    if (result == NULL)
    {
        /* Codes_SRS_AMQPVALUE_01_114: [If allocating the AMQP_VALUE fails then amqpvalue_create_uuid shall return NULL.] */
        LogError("Could not allocate memory for AMQP value");
    }
    else
    {
        /* Codes_SRS_AMQPVALUE_01_113: [amqpvalue_create_uuid shall return a handle to an AMQP_VALUE that stores an uuid value that represents a unique identifier per RFC-4122 section 4.1.2.] */
        result->type = AMQP_TYPE_UUID;
        (void)memcpy(&result->value.uuid_value, value, 16);
    }

    return result;
}